

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# views_pool.cpp
# Opt level: O2

void __thiscall cppcms::views::generator::~generator(generator *this)

{
  booster::hold_ptr<cppcms::views::generator::data>::~hold_ptr(&this->d);
  std::__cxx11::string::~string((string *)&this->name_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>_>
               *)this);
  return;
}

Assistant:

generator::~generator()
{
}